

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_18::NameGenerator::GenerateName
          (NameGenerator *this,char *prefix,Index index,uint disambiguator,string *str)

{
  int iVar1;
  Index extraout_EDX;
  Index extraout_EDX_00;
  Index index_00;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  string *local_28;
  string *str_local;
  uint disambiguator_local;
  Index index_local;
  char *prefix_local;
  NameGenerator *this_local;
  
  local_28 = str;
  str_local._0_4_ = disambiguator;
  str_local._4_4_ = index;
  _disambiguator_local = prefix;
  prefix_local = (char *)this;
  std::__cxx11::string::operator=((string *)str,"$");
  std::__cxx11::string::operator+=((string *)local_28,_disambiguator_local);
  if (str_local._4_4_ != 0xffffffff) {
    if ((this->opts_ & AlphaNames) == None) {
      std::__cxx11::to_string(&local_68,str_local._4_4_);
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    else {
      iVar1 = strcmp(_disambiguator_local,"p");
      if ((iVar1 == 0) || (iVar1 = strcmp(_disambiguator_local,"l"), iVar1 == 0)) {
        std::__cxx11::string::pop_back();
        index_00 = extraout_EDX;
      }
      else {
        std::__cxx11::string::operator+=((string *)local_28,'_');
        index_00 = extraout_EDX_00;
      }
      IndexToAlphaName_abi_cxx11_(&local_48,(wabt *)(ulong)str_local._4_4_,index_00);
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  if ((uint)str_local != 0) {
    std::__cxx11::to_string(&local_a8,(uint)str_local);
    std::operator+(&local_88,'_',&local_a8);
    std::__cxx11::string::operator+=((string *)local_28,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return;
}

Assistant:

void NameGenerator::GenerateName(const char* prefix,
                                 Index index,
                                 unsigned disambiguator,
                                 std::string* str) {
  *str = "$";
  *str += prefix;
  if (index != kInvalidIndex) {
    if (opts_ & NameOpts::AlphaNames) {
      // For params and locals, do not use a prefix char.
      if (!strcmp(prefix, "p") || !strcmp(prefix, "l")) {
        str->pop_back();
      } else {
        *str += '_';
      }
      *str += IndexToAlphaName(index);
    } else {
      *str += std::to_string(index);
    }
  }
  if (disambiguator != 0) {
    *str += '_' + std::to_string(disambiguator);
  }
}